

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

bool operator==(CECoordinates *lhs,CECoordinates *rhs)

{
  bool bVar1;
  double dVar2;
  CEAngle angsep;
  CEAngle local_30;
  double local_10;
  
  if (lhs->coord_type_ == rhs->coord_type_) {
    CECoordinates::AngularSeparation((CECoordinates *)&stack0xffffffffffffffe0,lhs,rhs);
    local_10 = CEAngle::operator_cast_to_double((CEAngle *)&stack0xffffffffffffffe0);
    CEAngle::CEAngle(&local_30,&stack0xfffffffffffffff0);
    CEAngle::~CEAngle((CEAngle *)&stack0xffffffffffffffe0);
    dVar2 = CEAngle::operator_cast_to_double(&local_30);
    bVar1 = dVar2 <= 1.4544e-05;
    CEAngle::~CEAngle(&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const CECoordinates& lhs, const CECoordinates& rhs)
{
    bool are_equal = true;
    
    // Check the coordinate systems are equivalent
    if (lhs.GetCoordSystem() != rhs.GetCoordSystem()) {
        are_equal = false;
    }
    // Check that the x-coordinate and the y-coordinate are the same
    else {
        // Check how far appart the coordinates are from each other
        CEAngle angsep = CECoordinates::AngularSeparation(lhs, rhs);
        // Currently require separation < 0.03 arcsec
        double marcsec_rad = 4.848e-6;
        if (angsep > 3.0*marcsec_rad) {
            are_equal = false;
        }
    }

    return are_equal;
}